

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,string *name)

{
  cmSourceGroupInternals *pcVar1;
  cmSourceGroup *pcVar2;
  __type _Var3;
  cmSourceGroup *group;
  cmSourceGroup *__lhs;
  
  pcVar1 = (this->Internal)._M_t.
           super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>
           .super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl;
  __lhs = *(cmSourceGroup **)
           &(pcVar1->GroupChildren).
            super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>;
  pcVar2 = *(pointer *)
            ((long)&(pcVar1->GroupChildren).
                    super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_> + 8);
  while( true ) {
    if (__lhs == pcVar2) {
      return (cmSourceGroup *)0x0;
    }
    _Var3 = std::operator==(&__lhs->Name,name);
    if (_Var3) break;
    __lhs = __lhs + 1;
  }
  return __lhs;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    // look if descenened is the one were looking for
    if (group.GetName() == name) {
      return (&group); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return nullptr;
}